

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_data_converter_process_pcm_frames__resampling_first
                    (ma_data_converter *pConverter,void *pFramesIn,ma_uint64 *pFrameCountIn,
                    void *pFramesOut,ma_uint64 *pFrameCountOut)

{
  ma_uint32 mVar1;
  undefined8 uVar2;
  ma_uint32 mVar3;
  ma_result mVar4;
  ulong uVar5;
  void *pvVar6;
  ma_uint64 mVar7;
  ma_uint64 requiredInputFrameCount;
  void *pChannelsBufferOut;
  void *pResampleBufferIn;
  void *pRunningFramesOut;
  void *pRunningFramesIn;
  ma_uint64 frameCountOutThisIteration;
  ma_uint64 frameCountInThisIteration;
  ma_uint64 tempBufferOutCap;
  ma_uint8 pTempBufferOut [4096];
  ma_uint64 tempBufferMidCap;
  ma_uint8 pTempBufferMid [4096];
  ma_uint64 tempBufferInCap;
  ma_uint8 pTempBufferIn [4096];
  ma_uint64 framesProcessedOut;
  ma_uint64 framesProcessedIn;
  ma_uint64 frameCountOut;
  ma_uint64 frameCountIn;
  ma_result result;
  ma_uint64 *pFrameCountOut_local;
  void *pFramesOut_local;
  ma_uint64 *pFrameCountIn_local;
  void *pFramesIn_local;
  ma_data_converter *pConverter_local;
  
  if (pConverter == (ma_data_converter *)0x0) {
    __assert_fail("pConverter != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x8828,
                  "ma_result ma_data_converter_process_pcm_frames__resampling_first(ma_data_converter *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                 );
  }
  if ((pConverter->resampler).config.format != (pConverter->channelConverter).format) {
    __assert_fail("pConverter->resampler.config.format == pConverter->channelConverter.format",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x8829,
                  "ma_result ma_data_converter_process_pcm_frames__resampling_first(ma_data_converter *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                 );
  }
  if ((pConverter->resampler).config.channels != (pConverter->channelConverter).channelsIn) {
    __assert_fail("pConverter->resampler.config.channels == pConverter->channelConverter.channelsIn"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x882a,
                  "ma_result ma_data_converter_process_pcm_frames__resampling_first(ma_data_converter *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                 );
  }
  if ((pConverter->channelConverter).channelsOut <= (pConverter->resampler).config.channels) {
    __assert_fail("pConverter->resampler.config.channels < pConverter->channelConverter.channelsOut"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x882b,
                  "ma_result ma_data_converter_process_pcm_frames__resampling_first(ma_data_converter *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                 );
  }
  frameCountOut = 0;
  if (pFrameCountIn != (ma_uint64 *)0x0) {
    frameCountOut = *pFrameCountIn;
  }
  framesProcessedIn = 0;
  if (pFrameCountOut != (ma_uint64 *)0x0) {
    framesProcessedIn = *pFrameCountOut;
  }
  framesProcessedOut = 0;
  pTempBufferIn[0xff8] = '\0';
  pTempBufferIn[0xff9] = '\0';
  pTempBufferIn[0xffa] = '\0';
  pTempBufferIn[0xffb] = '\0';
  pTempBufferIn[0xffc] = '\0';
  pTempBufferIn[0xffd] = '\0';
  pTempBufferIn[0xffe] = '\0';
  pTempBufferIn[0xfff] = '\0';
  mVar1 = (pConverter->resampler).config.channels;
  mVar3 = ma_get_bytes_per_sample((pConverter->resampler).config.format);
  uVar5 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / ZEXT416(mVar3 * mVar1),0);
  mVar1 = (pConverter->resampler).config.channels;
  mVar3 = ma_get_bytes_per_sample((pConverter->resampler).config.format);
  pvVar6 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / ZEXT416(mVar3 * mVar1),0);
  mVar1 = (pConverter->channelConverter).channelsOut;
  mVar3 = ma_get_bytes_per_sample((pConverter->channelConverter).format);
  frameCountInThisIteration =
       SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / ZEXT416(mVar3 * mVar1),0);
  do {
    if (framesProcessedIn <= (ulong)pTempBufferIn._4088_8_) break;
    pRunningFramesOut = (void *)0x0;
    pResampleBufferIn = (void *)0x0;
    if (pFramesIn != (void *)0x0) {
      mVar1 = (pConverter->config).channelsIn;
      mVar3 = ma_get_bytes_per_sample((pConverter->config).formatIn);
      pRunningFramesOut = (void *)((long)pFramesIn + framesProcessedOut * (mVar3 * mVar1));
    }
    uVar2 = pTempBufferIn._4088_8_;
    if (pFramesOut != (void *)0x0) {
      mVar1 = (pConverter->config).channelsOut;
      mVar3 = ma_get_bytes_per_sample((pConverter->config).formatOut);
      pResampleBufferIn = (void *)((long)pFramesOut + uVar2 * (ulong)(mVar3 * mVar1));
    }
    frameCountOutThisIteration = frameCountOut - framesProcessedOut;
    if (((pConverter->field_0x2768 & 1) != 0) && (uVar5 < frameCountOutThisIteration)) {
      frameCountOutThisIteration = uVar5;
    }
    pRunningFramesIn = (void *)(framesProcessedIn - pTempBufferIn._4088_8_);
    if (pvVar6 < (void *)(framesProcessedIn - pTempBufferIn._4088_8_)) {
      pRunningFramesIn = pvVar6;
    }
    if ((((byte)pConverter->field_0x2768 >> 1 & 1) != 0) &&
       (frameCountInThisIteration < pRunningFramesIn)) {
      pRunningFramesIn = (void *)frameCountInThisIteration;
    }
    mVar7 = ma_resampler_get_required_input_frame_count
                      (&pConverter->resampler,(ma_uint64)pRunningFramesIn);
    if (mVar7 < frameCountOutThisIteration) {
      frameCountOutThisIteration = mVar7;
    }
    if ((pConverter->field_0x2768 & 1) == 0) {
      pChannelsBufferOut = pRunningFramesOut;
    }
    else if (pFramesIn == (void *)0x0) {
      pChannelsBufferOut = (void *)0x0;
    }
    else {
      ma_convert_pcm_frames_format
                (&tempBufferInCap,(pConverter->resampler).config.format,pRunningFramesOut,
                 (pConverter->config).formatIn,frameCountOutThisIteration,
                 (pConverter->config).channelsIn,(pConverter->config).ditherMode);
      pChannelsBufferOut = &tempBufferInCap;
    }
    mVar4 = ma_resampler_process_pcm_frames
                      (&pConverter->resampler,pChannelsBufferOut,&frameCountOutThisIteration,
                       &tempBufferMidCap,(ma_uint64 *)&pRunningFramesIn);
    if (mVar4 != 0) {
      return mVar4;
    }
    if (pFramesOut != (void *)0x0) {
      if (((byte)pConverter->field_0x2768 >> 1 & 1) == 0) {
        requiredInputFrameCount = (ma_uint64)pResampleBufferIn;
      }
      else {
        requiredInputFrameCount = (ma_uint64)&tempBufferOutCap;
      }
      mVar4 = ma_channel_converter_process_pcm_frames
                        (&pConverter->channelConverter,(void *)requiredInputFrameCount,
                         &tempBufferMidCap,(ma_uint64)pRunningFramesIn);
      if (mVar4 != 0) {
        return mVar4;
      }
      if (((byte)pConverter->field_0x2768 >> 1 & 1) != 0) {
        ma_convert_pcm_frames_format
                  (pResampleBufferIn,(pConverter->config).formatOut,(void *)requiredInputFrameCount,
                   (pConverter->channelConverter).format,(ma_uint64)pRunningFramesIn,
                   (pConverter->channelConverter).channelsOut,(pConverter->config).ditherMode);
      }
    }
    framesProcessedOut = frameCountOutThisIteration + framesProcessedOut;
    pTempBufferIn._4088_8_ = (long)pRunningFramesIn + pTempBufferIn._4088_8_;
    if (frameCountOut < framesProcessedOut) {
      __assert_fail("framesProcessedIn <= frameCountIn",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                    ,0x8895,
                    "ma_result ma_data_converter_process_pcm_frames__resampling_first(ma_data_converter *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                   );
    }
    if (framesProcessedIn < (ulong)pTempBufferIn._4088_8_) {
      __assert_fail("framesProcessedOut <= frameCountOut",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                    ,0x8896,
                    "ma_result ma_data_converter_process_pcm_frames__resampling_first(ma_data_converter *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                   );
    }
  } while (pRunningFramesIn != (void *)0x0);
  if (pFrameCountIn != (ma_uint64 *)0x0) {
    *pFrameCountIn = framesProcessedOut;
  }
  if (pFrameCountOut != (ma_uint64 *)0x0) {
    *pFrameCountOut = pTempBufferIn._4088_8_;
  }
  return 0;
}

Assistant:

static ma_result ma_data_converter_process_pcm_frames__resampling_first(ma_data_converter* pConverter, const void* pFramesIn, ma_uint64* pFrameCountIn, void* pFramesOut, ma_uint64* pFrameCountOut)
{
    ma_result result;
    ma_uint64 frameCountIn;
    ma_uint64 frameCountOut;
    ma_uint64 framesProcessedIn;
    ma_uint64 framesProcessedOut;
    ma_uint8  pTempBufferIn[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];   /* In resampler format. */
    ma_uint64 tempBufferInCap;
    ma_uint8  pTempBufferMid[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];  /* In resampler format, channel converter input format. */
    ma_uint64 tempBufferMidCap;
    ma_uint8  pTempBufferOut[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];  /* In channel converter output format. */
    ma_uint64 tempBufferOutCap;

    MA_ASSERT(pConverter != NULL);
    MA_ASSERT(pConverter->resampler.config.format   == pConverter->channelConverter.format);
    MA_ASSERT(pConverter->resampler.config.channels == pConverter->channelConverter.channelsIn);
    MA_ASSERT(pConverter->resampler.config.channels <  pConverter->channelConverter.channelsOut);

    frameCountIn = 0;
    if (pFrameCountIn != NULL) {
        frameCountIn = *pFrameCountIn;
    }

    frameCountOut = 0;
    if (pFrameCountOut != NULL) {
        frameCountOut = *pFrameCountOut;
    }

    framesProcessedIn  = 0;
    framesProcessedOut = 0;

    tempBufferInCap  = sizeof(pTempBufferIn)  / ma_get_bytes_per_frame(pConverter->resampler.config.format, pConverter->resampler.config.channels);
    tempBufferMidCap = sizeof(pTempBufferIn)  / ma_get_bytes_per_frame(pConverter->resampler.config.format, pConverter->resampler.config.channels);
    tempBufferOutCap = sizeof(pTempBufferOut) / ma_get_bytes_per_frame(pConverter->channelConverter.format, pConverter->channelConverter.channelsOut);

    while (framesProcessedOut < frameCountOut) {
        ma_uint64 frameCountInThisIteration;
        ma_uint64 frameCountOutThisIteration;
        const void* pRunningFramesIn = NULL;
        void* pRunningFramesOut = NULL;
        const void* pResampleBufferIn;
        void* pChannelsBufferOut;

        if (pFramesIn != NULL) {
            pRunningFramesIn  = ma_offset_ptr(pFramesIn,  framesProcessedIn  * ma_get_bytes_per_frame(pConverter->config.formatIn, pConverter->config.channelsIn));
        }
        if (pFramesOut != NULL) {
            pRunningFramesOut = ma_offset_ptr(pFramesOut, framesProcessedOut * ma_get_bytes_per_frame(pConverter->config.formatOut, pConverter->config.channelsOut));
        }

        /* Run input data through the resampler and output it to the temporary buffer. */
        frameCountInThisIteration = (frameCountIn - framesProcessedIn);

        if (pConverter->hasPreFormatConversion) {
            if (frameCountInThisIteration > tempBufferInCap) {
                frameCountInThisIteration = tempBufferInCap;
            }
        }

        frameCountOutThisIteration = (frameCountOut - framesProcessedOut);
        if (frameCountOutThisIteration > tempBufferMidCap) {
            frameCountOutThisIteration = tempBufferMidCap;
        }

        /* We can't read more frames than can fit in the output buffer. */
        if (pConverter->hasPostFormatConversion) {
            if (frameCountOutThisIteration > tempBufferOutCap) {
                frameCountOutThisIteration = tempBufferOutCap;
            }
        }

        /* We need to ensure we don't try to process too many input frames that we run out of room in the output buffer. If this happens we'll end up glitching. */
        {
            ma_uint64 requiredInputFrameCount = ma_resampler_get_required_input_frame_count(&pConverter->resampler, frameCountOutThisIteration);
            if (frameCountInThisIteration > requiredInputFrameCount) {
                frameCountInThisIteration = requiredInputFrameCount;
            }
        }

        if (pConverter->hasPreFormatConversion) {
            if (pFramesIn != NULL) {
                ma_convert_pcm_frames_format(pTempBufferIn, pConverter->resampler.config.format, pRunningFramesIn, pConverter->config.formatIn, frameCountInThisIteration, pConverter->config.channelsIn, pConverter->config.ditherMode);
                pResampleBufferIn = pTempBufferIn;
            } else {
                pResampleBufferIn = NULL;
            }
        } else {
            pResampleBufferIn = pRunningFramesIn;
        }

        result = ma_resampler_process_pcm_frames(&pConverter->resampler, pResampleBufferIn, &frameCountInThisIteration, pTempBufferMid, &frameCountOutThisIteration);
        if (result != MA_SUCCESS) {
            return result;
        }


        /*
        The input data has been resampled so now we need to run it through the channel converter. The input data is always contained in pTempBufferMid. We only need to do
        this part if we have an output buffer.
        */
        if (pFramesOut != NULL) {
            if (pConverter->hasPostFormatConversion) {
                pChannelsBufferOut = pTempBufferOut;
            } else {
                pChannelsBufferOut = pRunningFramesOut;
            }

            result = ma_channel_converter_process_pcm_frames(&pConverter->channelConverter, pChannelsBufferOut, pTempBufferMid, frameCountOutThisIteration);
            if (result != MA_SUCCESS) {
                return result;
            }

            /* Finally we do post format conversion. */
            if (pConverter->hasPostFormatConversion) {
                ma_convert_pcm_frames_format(pRunningFramesOut, pConverter->config.formatOut, pChannelsBufferOut, pConverter->channelConverter.format, frameCountOutThisIteration, pConverter->channelConverter.channelsOut, pConverter->config.ditherMode);
            }
        }


        framesProcessedIn  += frameCountInThisIteration;
        framesProcessedOut += frameCountOutThisIteration;

        MA_ASSERT(framesProcessedIn  <= frameCountIn);
        MA_ASSERT(framesProcessedOut <= frameCountOut);

        if (frameCountOutThisIteration == 0) {
            break;  /* Consumed all of our input data. */
        }
    }

    if (pFrameCountIn != NULL) {
        *pFrameCountIn = framesProcessedIn;
    }
    if (pFrameCountOut != NULL) {
        *pFrameCountOut = framesProcessedOut;
    }

    return MA_SUCCESS;
}